

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

xmlDictEntry *
xmlDictFindEntry(xmlDict *dict,xmlChar *prefix,xmlChar *name,int len,uint hashValue,int *pfound)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int local_48;
  uint local_44;
  int found;
  uint displ;
  uint pos;
  uint mask;
  xmlDictEntry *entry;
  int *pfound_local;
  uint hashValue_local;
  int len_local;
  xmlChar *name_local;
  xmlChar *prefix_local;
  xmlDict *dict_local;
  
  local_48 = 0;
  uVar1 = (int)dict->size - 1;
  found = hashValue & uVar1;
  _pos = dict->table + (uint)found;
  if (_pos->hashValue != 0) {
    local_44 = 0;
    do {
      if (_pos->hashValue == hashValue) {
        if (prefix == (xmlChar *)0x0) {
          iVar2 = strncmp((char *)_pos->name,(char *)name,(long)len);
          if ((iVar2 == 0) && (_pos->name[len] == '\0')) {
            local_48 = 1;
            break;
          }
        }
        else {
          iVar2 = xmlStrQEqual(prefix,name,_pos->name);
          if (iVar2 != 0) {
            local_48 = 1;
            break;
          }
        }
      }
      local_44 = local_44 + 1;
      found = found + 1;
      _pos = _pos + 1;
      if ((found & uVar1) == 0) {
        _pos = dict->table;
      }
      bVar3 = false;
      if (_pos->hashValue != 0) {
        bVar3 = local_44 <= (found - _pos->hashValue & uVar1);
      }
    } while (bVar3);
  }
  *pfound = local_48;
  return _pos;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static xmlDictEntry *
xmlDictFindEntry(const xmlDict *dict, const xmlChar *prefix,
                 const xmlChar *name, int len, unsigned hashValue,
                 int *pfound) {
    xmlDictEntry *entry;
    unsigned mask, pos, displ;
    int found = 0;

    mask = dict->size - 1;
    pos = hashValue & mask;
    entry = &dict->table[pos];

    if (entry->hashValue != 0) {
        /*
         * Robin hood hashing: abort if the displacement of the entry
         * is smaller than the displacement of the key we look for.
         * This also stops at the correct position when inserting.
         */
        displ = 0;

        do {
            if (entry->hashValue == hashValue) {
                if (prefix == NULL) {
                    /*
                     * name is not necessarily null-terminated.
                     */
                    if ((strncmp((const char *) entry->name,
                                 (const char *) name, len) == 0) &&
                        (entry->name[len] == 0)) {
                        found = 1;
                        break;
                    }
                } else {
                    if (xmlStrQEqual(prefix, name, entry->name)) {
                        found = 1;
                        break;
                    }
                }
            }

            displ++;
            pos++;
            entry++;
            if ((pos & mask) == 0)
                entry = dict->table;
        } while ((entry->hashValue != 0) &&
                 (((pos - entry->hashValue) & mask) >= displ));
    }

    *pfound = found;
    return(entry);
}